

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_taglo_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  ulong uVar1;
  
  uVar1 = (ulong)((uint)arg1 & 0xfffffcf6);
  if ((env->hflags >> 0x1b & 1) != 0) {
    uVar1 = arg1;
  }
  env->CP0_TagLo = uVar1;
  return;
}

Assistant:

void helper_mtc0_taglo(CPUMIPSState *env, target_ulong arg1)
{
    if (env->hflags & MIPS_HFLAG_ITC_CACHE) {
        /*
         * If CACHE instruction is configured for ITC tags then make all
         * CP0.TagLo bits writable. The actual write to ITC Configuration
         * Tag will take care of the read-only bits.
         */
        env->CP0_TagLo = arg1;
    } else {
        env->CP0_TagLo = arg1 & 0xFFFFFCF6;
    }
}